

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

Node * __thiscall
QHashPrivate::Data<QCache<unsigned_long_long,_QOpenGLCachedTexture>::Node>::
findNode<unsigned_long_long>
          (Data<QCache<unsigned_long_long,_QOpenGLCachedTexture>::Node> *this,
          unsigned_long_long *key)

{
  ulong uVar1;
  Node *pNVar2;
  Bucket BVar3;
  
  BVar3 = findBucket<unsigned_long_long>(this,key);
  uVar1 = (ulong)(BVar3.span)->offsets[BVar3.index];
  if (uVar1 == 0xff) {
    pNVar2 = (Node *)0x0;
  }
  else {
    pNVar2 = (Node *)((BVar3.span)->entries + uVar1);
  }
  return pNVar2;
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }